

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_aliases.h
# Opt level: O3

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,short,11ul>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               aliases_t<char,_4UL,_short,_11UL> *fmt)

{
  ulong uVar1;
  char cVar2;
  char *pcVar3;
  byte bVar4;
  pair<date::static_string<char,_4UL>,_short> *ppVar5;
  size_t k;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  array<bool,_11UL> is_match;
  array<const_char_*,_11UL> str_list;
  char acStack_93 [11];
  long alStack_88 [11];
  
  ppVar5 = fmt->aliases->_M_elems;
  lVar6 = 0;
  do {
    alStack_88[lVar6] = (long)ppVar5;
    acStack_93[lVar6] =
         (((pair<date::static_string<char,_4UL>,_short> *)&ppVar5->first)->first).m_length != 0;
    lVar6 = lVar6 + 1;
    ppVar5 = ppVar5 + 1;
  } while (lVar6 != 0xb);
  bVar9 = true;
  uVar7 = 0;
  while (end->m_position != pos->m_position) {
    cVar2 = pos->m_cache[pos->m_position];
    lVar8 = 2;
    lVar6 = 0;
    do {
      if (acStack_93[lVar6] == '\x01') {
        pcVar3 = (char *)alStack_88[lVar6];
        if (*pcVar3 == cVar2) {
          if (pcVar3[1] == '\0') {
            iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++
                      (pos);
            *fmt->value = *(value_type_conflict *)
                           (&fmt->aliases->_M_elems[0].first.m_data)[lVar8 * 2]._M_elems;
            bVar4 = 1;
            goto LAB_0010865a;
          }
          alStack_88[lVar6] = (long)(pcVar3 + 1);
        }
        else {
          acStack_93[lVar6] = '\0';
        }
      }
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 3;
    } while (lVar8 != 0x23);
    uVar1 = uVar7 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
    bVar9 = uVar7 < 3;
    uVar7 = uVar1;
    if (uVar1 == 4) break;
  }
  bVar4 = 0;
LAB_0010865a:
  return (bool)(bVar9 & bVar4);
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, aliases_t<Char, Length, Value, Count>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    std::array<const Char*, Count> str_list;
    std::array<bool, Count> is_match;
    for (std::size_t k = 0; k < Count; ++k)
    {
        const auto& str = fmt.aliases[k].first;
        str_list[k] = str.c_str();
        is_match[k] = !str.empty();
    }

    for (std::size_t i = 0; i < Length; ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        for (std::size_t k = 0; k < Count; ++k)
        {
            if (!is_match[k])
                continue;
            
            const Char* str = str_list[k];
            if (*str != ch)
            {
                is_match[k] = false;
                continue;
            }

            ++str;
            if (*str != Char{ '\0' })
            {
                str_list[k] = str;
                continue;
            }

            ++pos;
            fmt.value = fmt.aliases[k].second;
            return read_impl(pos, end, std::forward<Others>(others)...);
        }
    }

    return false;
}